

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

String * __thiscall
Console::Prompt::Private::getLine(String *__return_storage_ptr__,Private *this,String *prompt)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  Iterator *pIVar4;
  int *piVar5;
  ssize_t sVar6;
  uint *data;
  usize uVar7;
  long lVar8;
  undefined1 local_198 [8];
  uint64 buffer_2;
  usize len_1;
  char buffer_1 [64];
  timeval tv;
  int nfds;
  fd_set *__arr;
  undefined1 auStack_120 [4];
  uint __i;
  fd_set fdr;
  usize len;
  char buffer [64];
  String local_48;
  String *local_20;
  String *prompt_local;
  Private *this_local;
  String *result;
  
  local_20 = prompt;
  prompt_local = (String *)this;
  this_local = (Private *)__return_storage_ptr__;
  if ((this->valid & 1U) == 0) {
    String::String(__return_storage_ptr__);
  }
  else {
    redirectPendingData(this);
    enableTerminalRawMode(this);
    saveCursorPosition(this);
    stringToConcharArray(this,local_20,&this->prompt);
    pIVar4 = List<String>::end(&this->history);
    (this->historyPos).item = pIVar4->item;
    this->historyRemoveLast = false;
    Array<unsigned_int>::clear(&this->input);
    this->inputComplete = false;
    this->caretPos = 0;
    String::String(&local_48);
    promptWrite(this,0,&local_48);
    String::~String(&local_48);
LAB_00112f0b:
    do {
      bVar2 = Buffer::isEmpty(&this->bufferedInput);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        fdr.fds_bits[0xf] = readChar(this,(char *)&len);
        handleInput(this,(char *)&len,fdr.fds_bits[0xf]);
        if ((this->inputComplete & 1U) == 0) goto LAB_00112f0b;
      }
      if ((this->inputComplete & 1U) != 0) {
        promptClear(this);
        restoreCursorPosition(this);
        flushConsole(this);
        restoreTerminalMode(this);
        String::String(__return_storage_ptr__);
        data = Array::operator_cast_to_unsigned_int_((Array *)&this->input);
        uVar7 = Array<unsigned_int>::size(&this->input);
        concharArrayToString(this,data,uVar7,__return_storage_ptr__);
        if ((this->historyRemoveLast & 1U) != 0) {
          List<String>::removeBack(&this->history);
        }
        bVar2 = String::isEmpty(__return_storage_ptr__);
        if (bVar2) {
          return __return_storage_ptr__;
        }
        List<String>::append(&this->history,__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
        fdr.fds_bits[(ulong)__arr._4_4_ - 1] = 0;
      }
      lVar8 = (long)(this->stdoutRead / 0x40);
      fdr.fds_bits[lVar8 + -1] =
           1L << ((byte)((long)this->stdoutRead % 0x40) & 0x3f) | fdr.fds_bits[lVar8 + -1];
      lVar8 = (long)(this->stderrRead / 0x40);
      fdr.fds_bits[lVar8 + -1] =
           1L << ((byte)((long)this->stderrRead % 0x40) & 0x3f) | fdr.fds_bits[lVar8 + -1];
      _auStack_120 = _auStack_120 | 1;
      fdr.fds_bits[(long)(resizeEventFd / 0x40) + -1] =
           1L << ((byte)((long)resizeEventFd % 0x40) & 0x3f) |
           fdr.fds_bits[(long)(resizeEventFd / 0x40) + -1];
      tv.tv_usec._4_4_ = this->stdoutRead;
      if (tv.tv_usec._4_4_ < this->stderrRead) {
        tv.tv_usec._4_4_ = this->stderrRead;
      }
      if (tv.tv_usec._4_4_ < resizeEventFd) {
        tv.tv_usec._4_4_ = resizeEventFd;
      }
      builtin_strncpy(buffer_1 + 0x38,"@B\x0f",4);
      buffer_1[0x3c] = '\0';
      buffer_1[0x3d] = '\0';
      buffer_1[0x3e] = '\0';
      buffer_1[0x3f] = '\0';
      flushConsole(this);
      iVar3 = select(tv.tv_usec._4_4_ + 1,(fd_set *)auStack_120,(fd_set *)0x0,(fd_set *)0x0,
                     (timeval *)(buffer_1 + 0x38));
      if (iVar3 != -1) {
        if (iVar3 != 0) {
          if ((fdr.fds_bits[(long)(this->stdoutRead / 0x40) + -1] &
              1L << ((byte)((long)this->stdoutRead % 0x40) & 0x3f)) != 0) {
            handleOutput(this,this->stdoutRead,originalStdout);
          }
          if ((fdr.fds_bits[(long)(this->stderrRead / 0x40) + -1] &
              1L << ((byte)((long)this->stderrRead % 0x40) & 0x3f)) != 0) {
            handleOutput(this,this->stderrRead,this->originalStderr);
          }
          if ((_auStack_120 & 1) != 0) {
            buffer_2 = readChar(this,(char *)&len_1);
            handleInput(this,(char *)&len_1,buffer_2);
          }
          if (((fdr.fds_bits[(long)(resizeEventFd / 0x40) + -1] &
               1L << ((byte)((long)resizeEventFd % 0x40) & 0x3f)) != 0) &&
             (sVar6 = read(resizeEventFd,local_198,8), sVar6 == 8)) {
            uVar7 = getScreenWidth(this);
            handleResize(this,uVar7);
          }
        }
        goto LAB_00112f0b;
      }
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                          ,0x309,"false");
    if (iVar3 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    String::String(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

String getLine(const String& prompt)
  {
    if(!valid)
    {
      // todo: print std and read line from stdin 
      return String();
    }

    // write pending stdout data
    redirectPendingData();

    //
    enableTerminalRawMode();
    saveCursorPosition();

    // initialize and write prompt
    stringToConcharArray(prompt, this->prompt);
    historyPos = history.end();
    historyRemoveLast = false;
    input.clear();
    inputComplete = false;
    caretPos = 0;
    promptWrite();

#ifdef _MSC_VER
    // wait for io
    HANDLE hStdIn = GetStdHandle(STD_INPUT_HANDLE);
    HANDLE handles[] = {hStdIn, outOverlapped.hEvent, errOverlapped.hEvent};
    while(!inputComplete)
    {
      DWORD dw = WaitForMultipleObjects(3, handles, FALSE, INFINITE);
      switch(dw)
      {
      case WAIT_OBJECT_0:
        {
          INPUT_RECORD records[1];
          DWORD read;
          VERIFY(ReadConsoleInput(hStdIn, records, 1, &read));
          usize keyEvents = 0;
          for(DWORD i = 0; i < read; ++i)
            switch(records[i].EventType)
            {
            case WINDOW_BUFFER_SIZE_EVENT:
              handleResize(records[i].Event.WindowBufferSizeEvent.dwSize.X);
              break;
            case KEY_EVENT:
              {
                const KEY_EVENT_RECORD& keyEvent = records[i].Event.KeyEvent;
                if(keyEvent.bKeyDown)
#ifdef _UNICODE
                  handleInput(keyEvent.uChar.UnicodeChar, keyEvent.wVirtualKeyCode);
#else
                  handleInput(keyEvent.uChar.AsciiChar, keyEvent.wVirtualKeyCode);
#endif
              }
              break;
            }
        }
        break;
      case WAIT_OBJECT_0 + 1:
        handleOutput(hStdOutRead, hOriginalStdOut, stdoutBuffer, sizeof(stdoutBuffer), outOverlapped);
        break;
      case WAIT_OBJECT_0 + 2:
        handleOutput(hStdErrRead, hOriginalStdErr, stderrBuffer, sizeof(stderrBuffer), errOverlapped);
        break;
      default:
        break;
      }
    }

#else
    for(;;)
    {
      while(!bufferedInput.isEmpty())
      {
        char buffer[64];
        usize len = readChar(buffer);
        handleInput(buffer, len);
        if(inputComplete)
          break;
      }
      if(inputComplete)
        break;

      fd_set fdr;
      FD_ZERO(&fdr);
      FD_SET(stdoutRead, &fdr);
      FD_SET(stderrRead, &fdr);
      FD_SET(STDIN_FILENO, &fdr);
      FD_SET(resizeEventFd, &fdr);
      int nfds = stdoutRead;
      if(stderrRead > nfds)
        nfds = stderrRead;
      if(resizeEventFd > nfds)
        nfds = resizeEventFd;
      timeval tv = {1000000, 0};
      flushConsole();
      switch(select(nfds + 1, &fdr, 0, 0, &tv))
      {
      case 0:
        continue;
      case -1:
        if(errno == EINTR)
          continue;
        ASSERT(false);
        return String();
      }
      if(FD_ISSET(stdoutRead, &fdr))
        handleOutput(stdoutRead, originalStdout);
      if(FD_ISSET(stderrRead, &fdr))
        handleOutput(stderrRead, originalStderr);
      if(FD_ISSET(STDIN_FILENO, &fdr))
      {
        char buffer[64];
        usize len = readChar(buffer);
        handleInput(buffer, len);
      }
      if(FD_ISSET(resizeEventFd, &fdr))
      {
        uint64 buffer;
        if(read(resizeEventFd, &buffer, sizeof(uint64)) == sizeof(uint64))
          handleResize(getScreenWidth());
      }
    }

#endif
    promptClear();
    restoreCursorPosition();
#ifndef _MSC_VER
    flushConsole();
#endif
    restoreTerminalMode();
    String result;
    concharArrayToString(input, input.size(), result);
    if(historyRemoveLast)
      history.removeBack();
    if(!result.isEmpty())
      history.append(result);
    return result;
  }